

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_factory.cxx
# Opt level: O0

cse_abstract * __thiscall
factory_item<xray_re::se_smart_cover>::create(factory_item<xray_re::se_smart_cover> *this)

{
  se_smart_cover *this_00;
  anon_union_8_3_e9edf90f_for_xr_clsid_0 *paVar1;
  anon_union_8_3_e9edf90f_for_xr_clsid_0 *paVar2;
  cse_abstract *local_40;
  se_smart_cover *p;
  factory_item<xray_re::se_smart_cover> *this_local;
  
  this_00 = (se_smart_cover *)operator_new(0x198);
  xray_re::se_smart_cover::se_smart_cover(this_00);
  paVar1 = &factory_item_base::clsid(&this->super_factory_item_base)->field_0;
  paVar2 = &xray_re::cse_abstract::clsid
                      ((cse_abstract *)
                       &(this_00->super_cse_smart_cover).super_cse_alife_dynamic_object)->field_0;
  *paVar2 = *paVar1;
  local_40 = (cse_abstract *)0x0;
  if (this_00 != (se_smart_cover *)0x0) {
    local_40 = (cse_abstract *)&(this_00->super_cse_smart_cover).super_cse_alife_dynamic_object;
  }
  return local_40;
}

Assistant:

cse_abstract* factory_item<T>::create()
{
	T* p = new T;
	p->clsid() = clsid();
	return p;
}